

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

void __thiscall absl::lts_20250127::Mutex::Unlock(Mutex *this)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  
  DebugOnlyLockLeave(this);
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  uVar2 = (uint)uVar1;
  if ((uVar2 & 9) != 8) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x6b4,"Mutex unlocked when destroyed or not locked: v=0x%x",
               uVar1 & 0xffffffff);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x6b4,"void absl::Mutex::Unlock()");
  }
  bVar3 = (uVar2 & 6) != 4 && (uVar2 & 0x18) == 8;
  uVar2 = uVar2 & 0x16 ^ 2;
  if (bVar3 != uVar2 < 6) {
    raw_log_internal::RawLog
              (kFatal,"mutex.cc",0x6db,"internal logic error %llx %llx %llx\n",uVar1,(ulong)bVar3,
               (ulong)(uVar2 < 6));
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x6db,"void absl::Mutex::Unlock()");
  }
  if (uVar2 < 6) {
    LOCK();
    bVar3 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i = uVar1 & 0xffffffffffffffd6;
    }
    UNLOCK();
    if (bVar3) {
      return;
    }
  }
  UnlockSlow(this,(SynchWaitParams *)0x0);
  return;
}

Assistant:

void Mutex::Unlock() {
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, 0);
  DebugOnlyLockLeave(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);

  if (kDebugMode && ((v & (kMuWriter | kMuReader)) != kMuWriter)) {
    ABSL_RAW_LOG(FATAL, "Mutex unlocked when destroyed or not locked: v=0x%x",
                 static_cast<unsigned>(v));
  }

  // should_try_cas is whether we'll try a compare-and-swap immediately.
  // NOTE: optimized out when kDebugMode is false.
  bool should_try_cas = ((v & (kMuEvent | kMuWriter)) == kMuWriter &&
                         (v & (kMuWait | kMuDesig)) != kMuWait);

  // But, we can use an alternate computation of it, that compilers
  // currently don't find on their own.  When that changes, this function
  // can be simplified.
  //
  // should_try_cas is true iff the bits satisfy the following conditions:
  //
  //                   Ev Wr Wa De
  // equal to           0  1
  // and not equal to         1  0
  //
  // after xoring by    0  1  0  1,  this is equivalent to:
  //
  // equal to           0  0
  // and not equal to         1  1,  which is the same as:
  //
  // smaller than       0  0  1  1
  static_assert(kMuEvent > kMuWait, "Needed for should_try_cas_fast");
  static_assert(kMuEvent > kMuDesig, "Needed for should_try_cas_fast");
  static_assert(kMuWriter > kMuWait, "Needed for should_try_cas_fast");
  static_assert(kMuWriter > kMuDesig, "Needed for should_try_cas_fast");

  bool should_try_cas_fast =
      ((v ^ (kMuWriter | kMuDesig)) &
       (kMuEvent | kMuWriter | kMuWait | kMuDesig)) < (kMuWait | kMuDesig);

  if (kDebugMode && should_try_cas != should_try_cas_fast) {
    // We would usually use PRIdPTR here, but is not correctly implemented
    // within the android toolchain.
    ABSL_RAW_LOG(FATAL, "internal logic error %llx %llx %llx\n",
                 static_cast<long long>(v),
                 static_cast<long long>(should_try_cas),
                 static_cast<long long>(should_try_cas_fast));
  }
  if (should_try_cas_fast &&
      mu_.compare_exchange_strong(v, v & ~(kMuWrWait | kMuWriter),
                                  std::memory_order_release,
                                  std::memory_order_relaxed)) {
    // fast writer release (writer with no waiters or with designated waker)
  } else {
    this->UnlockSlow(nullptr /*no waitp*/);  // take slow path
  }
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, 0);
}